

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldScalarNonZeroTest_Test::
~NoFieldPresenceSwapFieldTest_ReflectionSwapFieldScalarNonZeroTest_Test
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldScalarNonZeroTest_Test *this)

{
  (this->super_NoFieldPresenceSwapFieldTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceSwapFieldTest_0190ebd0;
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x590);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest, ReflectionSwapFieldScalarNonZeroTest) {
  m1_.set_optional_int32(1);
  m2_.set_optional_int32(2);

  const FieldDescriptor* f = FindFieldByName("optional_int32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_TRUE(r1_->HasField(m1_, f));
  EXPECT_TRUE(r2_->HasField(m2_, f));
  EXPECT_EQ(2, m1_.optional_int32());
  EXPECT_EQ(1, m2_.optional_int32());

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped again.
  EXPECT_TRUE(r1_->HasField(m1_, f));
  EXPECT_TRUE(r2_->HasField(m2_, f));
  EXPECT_EQ(1, m1_.optional_int32());
  EXPECT_EQ(2, m2_.optional_int32());
}